

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int ARKodeGetTolScaleFactor(void *arkode_mem,sunrealtype *tolsfact)

{
  int line;
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar1 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    line = 0x89c;
  }
  else {
    if ((*(int *)((long)arkode_mem + 0x110) != 0) || (*(int *)((long)arkode_mem + 0xf0) != 0)) {
      *tolsfact = *(sunrealtype *)((long)arkode_mem + 0x378);
      return 0;
    }
    msgfmt = "time-stepping module does not use tolerances";
    iVar1 = -0x30;
    error_code = -0x30;
    line = 0x8a6;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,"ARKodeGetTolScaleFactor",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return iVar1;
}

Assistant:

int ARKodeGetTolScaleFactor(void* arkode_mem, sunrealtype* tolsfact)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not use tolerances
     (i.e., neither supports adaptivity nor needs an algebraic solver) */
  if ((!ark_mem->step_supports_implicit) && (!ark_mem->step_supports_adaptive))
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not use tolerances");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  *tolsfact = ark_mem->tolsf;
  return (ARK_SUCCESS);
}